

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  uint uVar6;
  GetterYs<int> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  GetterYRef *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  double dVar13;
  double dVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter1;
  dVar13 = (double)(prim + 1);
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  dVar1 = pGVar7->XScale;
  dVar2 = pGVar7->X0;
  dVar14 = log10((double)*(int *)((long)pGVar7->Ys +
                                 (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) *
                                 (long)pGVar7->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar5 = pTVar8->YAxis;
  pIVar9 = pIVar15->CurrentPlot;
  dVar3 = pIVar9->YAxis[iVar5].Range.Min;
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  IVar4 = pIVar15->PixelRange[iVar5].Min;
  fVar20 = (float)(pIVar15->Mx * ((dVar2 + dVar13 * dVar1) - (pIVar9->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar24 = (float)(pIVar15->My[iVar5] *
                   ((dVar3 + (double)(float)(dVar14 / pIVar15->LogDenY[iVar5]) *
                             (pIVar9->YAxis[iVar5].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  dVar1 = pGVar10->XScale;
  dVar2 = pGVar10->X0;
  dVar14 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar9 = pIVar16->CurrentPlot;
  dVar3 = pIVar9->YAxis[iVar5].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar5].Min;
  fVar18 = (float)(pIVar16->Mx * ((dVar2 + dVar13 * dVar1) - (pIVar9->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar19 = (float)(pIVar16->My[iVar5] *
                   ((dVar3 + (double)(float)(dVar14 / pIVar16->LogDenY[iVar5]) *
                             (pIVar9->YAxis[iVar5].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  fVar25 = (this->P12).x;
  fVar26 = (this->P12).y;
  fVar28 = (this->P11).x;
  fVar29 = (this->P11).y;
  fVar21 = fVar24 * fVar28 - fVar20 * fVar29;
  fVar30 = fVar25 * fVar19 - fVar26 * fVar18;
  fVar28 = fVar28 - fVar20;
  fVar25 = fVar25 - fVar18;
  fVar27 = fVar26 - fVar19;
  fVar31 = fVar27 * fVar28 - (fVar29 - fVar24) * fVar25;
  auVar22._0_4_ = fVar21 * fVar25 - fVar30 * fVar28;
  auVar22._4_4_ = fVar21 * fVar27 - fVar30 * (fVar29 - fVar24);
  auVar22._8_4_ = fVar24 * 0.0 - fVar26 * 0.0;
  auVar22._12_4_ = fVar24 * 0.0 - fVar26 * 0.0;
  auVar23._4_4_ = fVar31;
  auVar23._0_4_ = fVar31;
  auVar23._8_4_ = fVar27;
  auVar23._12_4_ = fVar27;
  auVar23 = divps(auVar22,auVar23);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  pIVar11[1].pos.x = fVar20;
  pIVar11[1].pos.y = fVar24;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  pIVar11[2].pos = auVar23._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  IVar4.y = fVar19;
  IVar4.x = fVar18;
  pIVar11[4].pos = IVar4;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  uVar6 = DrawList->_VtxCurrentIdx;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = uVar6;
  uVar17 = -(uint)(fVar24 < fVar19 && fVar26 < fVar29 || fVar19 < fVar24 && fVar29 < fVar26) & 1;
  puVar12[1] = uVar6 + uVar17 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar17 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar20;
  (this->P11).y = fVar24;
  (this->P12).x = fVar18;
  (this->P12).y = fVar19;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }